

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

_Bool roaring64_iterator_advance(roaring64_iterator_t *it)

{
  leaf_t leaf_00;
  _Bool _Var1;
  ushort uVar2;
  roaring64_iterator_t *in_RDI;
  uint16_t low16;
  leaf_t leaf;
  uint8_t in_stack_00000027;
  container_t *in_stack_00000028;
  _Bool in_stack_00000077;
  roaring64_iterator_t *in_stack_00000078;
  roaring64_bitmap_t *in_stack_00000080;
  leaf_t in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  _Bool local_1;
  
  if ((in_RDI->art_it).value == (art_val_t *)0x0) {
    if ((in_RDI->saturated_forward & 1U) == 0) {
      roaring64_iterator_init_at(in_stack_00000080,in_stack_00000078,in_stack_00000077);
      local_1 = (_Bool)(in_RDI->has_value & 1);
    }
    else {
      in_RDI->has_value = false;
      local_1 = false;
    }
  }
  else {
    leaf_00 = *(in_RDI->art_it).value;
    uVar2 = (ushort)in_RDI->value;
    get_container((roaring64_bitmap_t *)CONCAT26(uVar2,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffd8);
    get_typecode(leaf_00);
    _Var1 = container_iterator_next
                      (in_stack_00000028,in_stack_00000027,(roaring_container_iterator_t *)it,
                       (uint16_t *)leaf);
    if (_Var1) {
      in_RDI->value = in_RDI->high48 | (ulong)uVar2;
      in_RDI->has_value = true;
      local_1 = true;
    }
    else {
      _Var1 = art_iterator_next((art_iterator_t *)0x10df1c);
      if (_Var1) {
        local_1 = roaring64_iterator_init_at_leaf_first(in_RDI);
      }
      else {
        in_RDI->saturated_forward = true;
        in_RDI->has_value = false;
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool roaring64_iterator_advance(roaring64_iterator_t *it) {
    if (it->art_it.value == NULL) {
        if (it->saturated_forward) {
            return (it->has_value = false);
        }
        roaring64_iterator_init_at(it->r, it, /*first=*/true);
        return it->has_value;
    }
    leaf_t leaf = (leaf_t)*it->art_it.value;
    uint16_t low16 = (uint16_t)it->value;
    if (container_iterator_next(get_container(it->r, leaf), get_typecode(leaf),
                                &it->container_it, &low16)) {
        it->value = it->high48 | low16;
        return (it->has_value = true);
    }
    if (art_iterator_next(&it->art_it)) {
        return roaring64_iterator_init_at_leaf_first(it);
    }
    it->saturated_forward = true;
    return (it->has_value = false);
}